

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O2

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  char cVar1;
  bool bVar2;
  long *in_RDX;
  Slice *msg2;
  int iVar3;
  Slice *msg;
  Slice local_80;
  Slice local_70;
  Slice input;
  Slice value;
  Slice key;
  
  input.data_ = (char *)handler->_vptr_Handler;
  input.size_ = (size_t)handler[1]._vptr_Handler;
  if (input.size_ < (_func_int **)0xc) {
    msg = &key;
    key.data_ = "malformed WriteBatch (too small)";
    key.size_ = 0x20;
    msg2 = &value;
    value.data_ = "";
    value.size_ = 0;
  }
  else {
    Slice::remove_prefix(&input,0xc);
    key.data_ = "";
    key.size_ = 0;
    value.data_ = "";
    value.size_ = 0;
    iVar3 = 0;
    while (input.size_ != 0) {
      cVar1 = Slice::operator[](&input,0);
      Slice::remove_prefix(&input,1);
      if (cVar1 == '\0') {
        bVar2 = GetLengthPrefixedSlice(&input,&key);
        if (!bVar2) {
          local_70.data_ = "bad WriteBatch Delete";
          local_70.size_ = 0x15;
          goto LAB_00117b17;
        }
        (**(code **)(*in_RDX + 0x18))();
      }
      else {
        if (cVar1 != '\x01') {
          local_70.data_ = "unknown WriteBatch tag";
          local_70.size_ = 0x16;
          goto LAB_00117b17;
        }
        bVar2 = GetLengthPrefixedSlice(&input,&key);
        if ((!bVar2) || (bVar2 = GetLengthPrefixedSlice(&input,&value), !bVar2)) {
          local_70.data_ = "bad WriteBatch Put";
          local_70.size_ = 0x12;
          goto LAB_00117b17;
        }
        (**(code **)(*in_RDX + 0x10))();
      }
      iVar3 = iVar3 + 1;
    }
    if (*(int *)(handler->_vptr_Handler + 1) == iVar3) {
      (this->rep_)._M_dataplus._M_p = (pointer)0x0;
      return (Status)(char *)this;
    }
    local_70.data_ = "WriteBatch has wrong count";
    local_70.size_ = 0x1a;
LAB_00117b17:
    msg = &local_70;
    msg2 = &local_80;
    local_80.data_ = "";
    local_80.size_ = 0;
  }
  Status::Corruption((Status *)this,msg,msg2);
  return (Status)(char *)this;
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}